

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integration_test.cc
# Opt level: O0

void __thiscall
prometheus::anon_unknown_0::BasicAuthIntegrationTest::BasicAuthIntegrationTest
          (BasicAuthIntegrationTest *this)

{
  allocator local_26;
  allocator local_25 [20];
  allocator local_11;
  BasicAuthIntegrationTest *local_10;
  BasicAuthIntegrationTest *this_local;
  
  local_10 = this;
  IntegrationTest::IntegrationTest(&this->super_IntegrationTest);
  (this->super_IntegrationTest).super_Test._vptr_Test =
       (_func_int **)&PTR__BasicAuthIntegrationTest_00241e00;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->counter_name_,"example_total",&local_11);
  std::allocator<char>::~allocator((allocator<char> *)&local_11);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->username_,"test_user",local_25);
  std::allocator<char>::~allocator((allocator<char> *)local_25);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->password_,"test_password",&local_26);
  std::allocator<char>::~allocator((allocator<char> *)&local_26);
  std::shared_ptr<prometheus::Registry>::shared_ptr(&this->registry_);
  return;
}

Assistant:

void SetUp() override {
    IntegrationTest::SetUp();

    registry_ = RegisterSomeCounter(counter_name_, default_metrics_path_);

    exposer_->RegisterAuth(
        [&](const std::string& user, const std::string& password) {
          return user == username_ && password == password_;
        },
        "Some Auth Realm", default_metrics_path_);
  }